

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O2

void lmpar(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double delta,double *par,
          double *x,double *sdiag)

{
  size_t __size;
  int iVar1;
  double *x_00;
  double *x_01;
  double *pdVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_90;
  double local_60;
  double local_48;
  
  lVar4 = (long)N;
  __size = lVar4 * 8;
  x_00 = (double *)malloc(__size);
  x_01 = (double *)malloc(__size);
  uVar11 = 0;
  uVar14 = 0;
  if (0 < N) {
    uVar14 = (ulong)(uint)N;
  }
  iVar1 = 1;
  uVar7 = (ulong)(uint)N;
  pdVar2 = r;
  for (; uVar12 = (uint)uVar7, uVar14 != uVar11; uVar11 = uVar11 + 1) {
    x_00[uVar11] = qtb[uVar11];
    uVar6 = (ulong)(iVar1 - 1);
    if (*pdVar2 != 0.0) {
      uVar6 = uVar7;
    }
    uVar5 = (uint)uVar6;
    if (NAN(*pdVar2)) {
      uVar5 = uVar12;
    }
    if (uVar12 == N) {
      uVar7 = (ulong)uVar5;
    }
    if ((int)uVar7 < N) {
      x_00[uVar11] = 0.0;
    }
    iVar1 = iVar1 + 1;
    pdVar2 = pdVar2 + lVar4 + 1;
  }
  if (0 < (int)uVar12) {
    uVar5 = uVar12;
    for (uVar11 = 1; uVar5 = uVar5 - 1, uVar11 != uVar12 + 1; uVar11 = uVar11 + 1) {
      lVar9 = uVar7 - uVar11;
      dVar15 = x_00[lVar9];
      dVar16 = r[(N + 1) * (int)lVar9];
      x_00[lVar9] = dVar15 / dVar16;
      if (0 < lVar9) {
        uVar10 = uVar5;
        for (lVar13 = 1; lVar13 <= lVar9; lVar13 = lVar13 + 1) {
          x_00[lVar13 + -1] = x_00[lVar13 + -1] - r[(int)uVar10] * (dVar15 / dVar16);
          uVar10 = uVar10 + N;
        }
      }
    }
  }
  for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
    x[ipvt[uVar11]] = x_00[uVar11];
  }
  for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
    x_01[uVar11] = diag[uVar11] * x[uVar11];
  }
  dVar15 = enorm(x_01,N);
  local_48 = dVar15 - delta;
  if (delta * 0.1 < local_48) {
    local_60 = 0.0;
    if (N <= (int)uVar12) {
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        x_00[uVar11] = (x_01[ipvt[uVar11]] / dVar15) * diag[ipvt[uVar11]];
      }
      pdVar2 = r;
      for (uVar11 = 0; uVar11 != uVar14; uVar11 = uVar11 + 1) {
        dVar16 = 0.0;
        if (uVar11 != 0) {
          pdVar8 = pdVar2;
          for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
            dVar16 = dVar16 + *pdVar8 * x_00[uVar7];
            pdVar8 = pdVar8 + lVar4;
          }
        }
        x_00[uVar11] = (x_00[uVar11] - dVar16) / r[(N + 1) * (int)uVar11];
        pdVar2 = pdVar2 + 1;
      }
      local_60 = enorm(x_00,N);
      local_60 = ((local_48 / delta) / local_60) / local_60;
    }
    lVar9 = 1;
    pdVar2 = r;
    for (uVar11 = 0; uVar11 != uVar14; uVar11 = uVar11 + 1) {
      dVar16 = 0.0;
      pdVar8 = pdVar2;
      for (lVar13 = 0; lVar9 != lVar13; lVar13 = lVar13 + 1) {
        dVar16 = dVar16 + *pdVar8 * qtb[lVar13];
        pdVar8 = pdVar8 + lVar4;
      }
      x_00[uVar11] = dVar16 / diag[ipvt[uVar11]];
      lVar9 = lVar9 + 1;
      pdVar2 = pdVar2 + 1;
    }
    uVar11 = (ulong)(uint)N;
    dVar16 = enorm(x_00,N);
    local_90 = dVar16 / delta;
    if ((local_90 == 0.0) && (!NAN(local_90))) {
      local_90 = pmin(delta,0.1);
      local_90 = 2.22507385852e-308 / local_90;
    }
    dVar17 = pmax(*par,local_60);
    *par = dVar17;
    dVar17 = pmin(dVar17,local_90);
    dVar15 = (double)(~-(ulong)(dVar17 == 0.0) & (ulong)dVar17 |
                     (ulong)(dVar16 / dVar15) & -(ulong)(dVar17 == 0.0));
    iVar1 = 0;
    while( true ) {
      iVar3 = (int)uVar11;
      *par = dVar15;
      if ((dVar15 == 0.0) && (!NAN(dVar15))) {
        dVar15 = pmax(2.22507385852e-308,local_90 * 0.001);
        *par = dVar15;
      }
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      iVar1 = iVar1 + 1;
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        x_00[uVar11] = diag[uVar11] * dVar15;
      }
      qrsolv(r,iVar3,N,ipvt,x_00,qtb,x,sdiag);
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        x_01[uVar11] = diag[uVar11] * x[uVar11];
      }
      dVar15 = enorm(x_01,N);
      dVar16 = dVar15 - delta;
      if (((ABS(dVar16) <= delta * 0.1) || (iVar1 == 10)) ||
         ((local_60 == 0.0 && (((!NAN(local_60) && (local_48 < 0.0)) && (dVar16 <= local_48))))))
      break;
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        x_00[uVar11] = (x_01[ipvt[uVar11]] / dVar15) * diag[ipvt[uVar11]];
      }
      iVar3 = 1;
      pdVar2 = r;
      for (uVar11 = 0; uVar11 != uVar14; uVar11 = uVar11 + 1) {
        dVar15 = x_00[uVar11];
        dVar17 = sdiag[uVar11];
        x_00[uVar11] = dVar15 / dVar17;
        if ((long)uVar11 <= lVar4 + -2) {
          lVar9 = (long)iVar3;
          pdVar8 = (double *)(__size * lVar9 + (long)pdVar2);
          for (; lVar9 < lVar4; lVar9 = lVar9 + 1) {
            x_00[lVar9] = x_00[lVar9] - *pdVar8 * (dVar15 / dVar17);
            pdVar8 = pdVar8 + lVar4;
          }
        }
        iVar3 = iVar3 + 1;
        pdVar2 = pdVar2 + 1;
      }
      uVar11 = (ulong)(uint)N;
      dVar15 = enorm(x_00,N);
      if (0.0 < dVar16) {
        local_60 = pmax(local_60,*par);
      }
      if (dVar16 < 0.0) {
        local_90 = pmin(local_90,*par);
      }
      dVar15 = pmax(local_60,((dVar16 / delta) / dVar15) / dVar15 + *par);
      local_48 = dVar16;
    }
  }
  else {
    *par = 0.0;
  }
  free(x_00);
  free(x_01);
  return;
}

Assistant:

void lmpar(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double delta,double *par,double *x,double *sdiag) {
	int i,iter,j,jm1,jp1,k,l,nsing;
	double dxnorm,dwarf,fp,gnorm,parc,parl,paru,p1,p001,sum,temp,zero;
	double *wa1,*wa2;
	/*
	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more

	 * N is a positive integer input variable set to the order of r.

       r is an N by N array. on input the full upper triangle
         must contain the full upper triangle of the matrix r.
         on output the full upper triangle is unaltered, and the
         strict lower triangle contains the strict upper triangle
         (transposed) of the upper triangular matrix s.

       ldr is a positive integer input variable not less than n
         which specifies the leading dimension of the array r.

       ipvt is an integer input array of length N which defines the
         permutation matrix p such that a*p = q*r. column j of p
         is column ipvt(j) of the identity matrix.

       diag is an input array of length N which must contain the
         diagonal elements of the matrix d.

       qtb is an input array of length N which must contain the first
         N elements of the vector (q transpose)*b.

       delta is a positive input variable which specifies an upper
         bound on the euclidean norm of d*x.

       par is a nonnegative variable. on input par contains an
         initial estimate of the levenberg-marquardt parameter.
         on output par contains the final estimate.

       x is an output array of length N which contains the least
         squares solution of the system a*x = b, sqrt(par)*d*x = 0,
         for the output par.

       sdiag is an output array of length N which contains the
         diagonal elements of the upper triangular matrix s.
    */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);

	p1 = 1.0e-01;
	p001 = 1.0e-03;
	zero = 0.0;
	dwarf = 2.22507385852e-308;

	//     compute and store in x the gauss-newton direction. if the
	//     jacobian is rank-deficient, obtain a least squares solution.

	nsing = N;

	for(j = 1; j <= N;++j) {
		wa1[j-1] = qtb[j-1];
		if (r[(j-1)*N+j-1] == zero && nsing == N) {
			nsing = j - 1;
		}
		if (nsing < N) {
			wa1[j-1] = zero;
		}
	}

	if (nsing >= 1) {//50
		for(k = 1; k <= nsing;++k) {
	         j = nsing - k + 1;
	         wa1[j-1] = wa1[j-1]/r[(j-1)*N+j-1];
	         temp = wa1[j-1];
	         jm1 = j - 1;
	         if (jm1 >= 1) {
	        	 for(i = 1; i <= jm1;++i) {
	        		 wa1[i-1] = wa1[i-1] - r[(i-1)*N+j-1]*temp;
	        	 }
	         }
		}
	}//50

	for (j = 0; j < N;++j) {
        l = ipvt[j];
        x[l] = wa1[j];
	}

	//     initialize the iteration counter.
	//     evaluate the function at the origin, and test
	//     for acceptance of the gauss-newton direction.

	iter = 0;

	for(j = 0; j < N;++j) {
		wa2[j] = diag[j]*x[j];
	}

	dxnorm = enorm(wa2,N);
	fp = dxnorm - delta;

	if (fp > p1*delta) {//220
		//     if the jacobian is not rank deficient, the newton
		//    step provides a lower bound, parl, for the zero of
		//     the function. otherwise set this bound to zero.
		parl = zero;

		if (nsing >= N) { //120 nsing only takes values upto N
			for(j = 0; j < N;++j) {
				l = ipvt[j];
				wa1[j] = diag[l]*(wa2[l]/dxnorm);
			}

			for(j = 0; j < N;++j) {//110
		         sum = zero;
		         jm1 = j - 1;
		         if (jm1 >= 0) {//100
		        	 for(i = 0; i <= jm1;++i) {//check
		        		 sum = sum + r[i*N+j]*wa1[i];
		        	 }
		         }//100
		         wa1[j] = (wa1[j] - sum)/r[j*N+j];
			}//110
		      temp = enorm(wa1,N);
		      parl = ((fp/delta)/temp)/temp;
		}//120

		//     calculate an upper bound, paru, for the zero of the function.

		for(j = 0; j < N;++j) {//140
			sum = zero;
			for(i = 0; i <= j;++i) {//check
				sum = sum + r[i*N+j]*qtb[i];
			}
	         l = ipvt[j];
	         wa1[j] = sum/diag[l];
		}//140
		gnorm = enorm(wa1,N);
		paru = gnorm/delta;

		if (paru == zero) {
			paru = dwarf/pmin(delta,p1);
		}

		//     if the input par lies outside of the interval (parl,paru),
		//     set par to the closer endpoint.

	      *par = pmax(*par,parl);
	      *par = pmin(*par,paru);

	      if (*par == zero) {
	    	  *par = gnorm/dxnorm;
	      }
	      //Iteration begins
	      while(1) {
	    	  iter++;
	    	  //        evaluate the function at the current value of par.
	    	  if (*par == zero) {
	    		  *par = pmax(dwarf,p001*paru);
	    	  }
	    	  temp = sqrt(*par);
	    	  for(j = 0; j < N;++j) {
	    		  wa1[j] = temp*diag[j];
	    	  }

	    	  qrsolv(r,ldr,N,ipvt,wa1,qtb,x,sdiag);
	    	  for(j = 0; j < N;++j) {
	              wa2[j] = diag[j]*x[j];
	    	  }

	          dxnorm = enorm(wa2,N);
	          temp = fp;
	          fp = dxnorm - delta;

	          //        if the function is small enough, accept the current value
	          //        of par. also test for the exceptional cases where parl
	          //        is zero or the number of iterations has reached 10.
	          if (fabs(fp) <= p1*delta) {
	        	  break;
	          }

	          if (iter == 10) {
	        	  break;
	          }

	          if (parl == zero && fp <= temp && temp < zero) {
	        	  break;
	          }

	          //        compute the newton correction.

	          for(j = 0;j < N;++j) {//180
	              l = ipvt[j];
	              wa1[j] = diag[l]*(wa2[l]/dxnorm);
	          }//180

	          for(j = 0; j < N;++j) {//210
	              wa1[j] = wa1[j]/sdiag[j];
	              temp = wa1[j];
	              jp1 = j + 1;
	              if (N >= jp1+1) {
	            	  for(i = jp1; i < N;++i) {
	            		  wa1[i] = wa1[i] - r[i*N+j]*temp;
	            	  }
	              }
	          }//210
	          temp = enorm(wa1,N);
	          parc = ((fp/delta)/temp)/temp;
	          //        depending on the sign of the function, update parl or paru.

	          if (fp > zero) {
	        	  parl = pmax(parl,*par);
	          }
	          if (fp < zero) {
	        	  paru = pmin(paru,*par);
	          }

	          //       compute an improved estimate for par.
	          *par = pmax(parl,*par+parc);

	      }

	}//220

	if (iter == 0) {
		*par = zero;
	}

	free(wa1);
	free(wa2);
}